

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Bytes __thiscall
Omega_h::lt_each<signed_char>(Omega_h *this,Read<signed_char> *a,Read<signed_char> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  int iVar3;
  int iVar4;
  void *extraout_RDX;
  LO LVar5;
  Bytes BVar6;
  Write<signed_char> c;
  type f;
  allocator local_71;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  type local_50;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)pAVar1->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 3);
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar4 = (int)pAVar2->size;
  }
  else {
    iVar4 = (int)((ulong)pAVar2 >> 3);
  }
  if (iVar3 == iVar4) {
    if (((ulong)pAVar1 & 1) == 0) {
      LVar5 = (LO)pAVar1->size;
    }
    else {
      LVar5 = (LO)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    Write<signed_char>::Write(&local_70,LVar5,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Write<signed_char>::Write(&local_50.c,&local_70);
    Write<signed_char>::Write(&local_50.a.write_,&a->write_);
    Write<signed_char>::Write(&local_50.b.write_,&b->write_);
    if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
      LVar5 = (LO)(local_70.shared_alloc_.alloc)->size;
    }
    else {
      LVar5 = (LO)((ulong)local_70.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::lt_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (LVar5,&local_50,"lt_each");
    Write<signed_char>::Write(&local_60,&local_70);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_60);
    Write<signed_char>::~Write(&local_60);
    lt_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)&local_50);
    Write<signed_char>::~Write(&local_70);
    BVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x101);
}

Assistant:

Bytes lt_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] < b[i]); };
  parallel_for(c.size(), f, "lt_each");
  return c;
}